

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth_pbuf.c
# Opt level: O0

csp_packet_t *
csp_eth_pbuf_new(csp_eth_interface_data_t *ifdata,uint32_t id,uint32_t now,int *task_woken)

{
  csp_eth_interface_data_t *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  csp_packet_t *packet;
  int *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  csp_packet_t *local_8;
  
  csp_eth_pbuf_cleanup
            (in_RCX,(uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),in_stack_ffffffffffffffd0);
  if (in_RCX == (csp_eth_interface_data_t *)0x0) {
    local_8 = csp_buffer_get(0x1148aa);
  }
  else {
    local_8 = csp_buffer_get_isr(0x11489a);
  }
  if (local_8 == (csp_packet_t *)0x0) {
    local_8 = (csp_packet_t *)0x0;
  }
  else {
    (local_8->field_0).field_1.last_used = in_EDX;
    (local_8->field_0).field_0.timestamp_rx = in_ESI;
    (local_8->field_0).field_1.frame_length = 0;
    local_8->next = *(csp_packet_s **)(in_RDI + 0x78);
    *(csp_packet_t **)(in_RDI + 0x78) = local_8;
  }
  return local_8;
}

Assistant:

csp_packet_t * csp_eth_pbuf_new(csp_eth_interface_data_t * ifdata, uint32_t id, uint32_t now, int * task_woken) {

	csp_eth_pbuf_cleanup(ifdata, now, task_woken);

	csp_packet_t * packet = (task_woken) ? csp_buffer_get_isr(0) : csp_buffer_get(0);
	if (packet == NULL) {
		return NULL;
	}

	packet->last_used = now;
	packet->cfpid = id;
	packet->frame_length = 0;

	/* Insert at beginning, because easy */
	packet->next = ifdata->pbufs;
	ifdata->pbufs = packet;

	return packet;
}